

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFile.cc
# Opt level: O3

int __thiscall avro::DataFileReaderBase::init(DataFileReaderBase *this,EVP_PKEY_CTX *ctx)

{
  ValidSchema *this_00;
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  ValidSchema *schema;
  ValidSchema *schema_00;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 local_a8;
  shared_count sStack_a0;
  DecoderPtr local_98;
  string local_88;
  string local_68;
  undefined8 local_48;
  shared_count sStack_40;
  element_type *local_38;
  shared_count asStack_30 [2];
  
  this_00 = &this->readerSchema_;
  boost::shared_ptr<avro::Node>::operator=(&this_00->root_,(shared_ptr<avro::Node> *)ctx);
  toString_abi_cxx11_(&local_68,(avro *)this_00,schema);
  toString_abi_cxx11_(&local_88,(avro *)&this->dataSchema_,schema_00);
  if (local_68._M_string_length == local_88._M_string_length) {
    if (local_68._M_string_length != 0) {
      iVar2 = bcmp(local_68._M_dataplus._M_p,local_88._M_dataplus._M_p,local_68._M_string_length);
      if (iVar2 != 0) goto LAB_00188c08;
    }
    binaryDecoder();
    bVar1 = false;
    uVar3 = (undefined4)local_48;
    uVar4 = local_48._4_4_;
    uVar5 = sStack_40.pi_._0_4_;
    uVar6 = sStack_40.pi_._4_4_;
  }
  else {
LAB_00188c08:
    binaryDecoder();
    resolvingDecoder((avro *)&local_a8,&this->dataSchema_,this_00,&local_98);
    uVar3 = (undefined4)local_a8;
    uVar4 = local_a8._4_4_;
    uVar5 = sStack_a0.pi_._0_4_;
    uVar6 = sStack_a0.pi_._4_4_;
    local_a8 = 0;
    sStack_a0.pi_ = (sp_counted_base *)0x0;
    bVar1 = true;
  }
  local_48 = 0;
  sStack_40.pi_ = (sp_counted_base *)0x0;
  local_38 = (this->dataDecoder_).px;
  asStack_30[0].pi_ = (this->dataDecoder_).pn.pi_;
  *(undefined4 *)&(this->dataDecoder_).px = uVar3;
  *(undefined4 *)((long)&(this->dataDecoder_).px + 4) = uVar4;
  *(undefined4 *)&(this->dataDecoder_).pn.pi_ = uVar5;
  *(undefined4 *)((long)&(this->dataDecoder_).pn.pi_ + 4) = uVar6;
  boost::detail::shared_count::~shared_count(asStack_30);
  boost::detail::shared_count::~shared_count(&sStack_40);
  if (bVar1) {
    boost::detail::shared_count::~shared_count(&sStack_a0);
    boost::detail::shared_count::~shared_count(&local_98.pn);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  bVar1 = readDataBlock(this);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

void DataFileReaderBase::init(const ValidSchema& readerSchema)
{
    readerSchema_ = readerSchema;
    dataDecoder_  = (toString(readerSchema_) != toString(dataSchema_)) ?
        resolvingDecoder(dataSchema_, readerSchema_, binaryDecoder()) :
        binaryDecoder();
    readDataBlock();
}